

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void runTest<main::__27>(char *name,bool condition,anon_class_40_5_9dbf9e49 f)

{
  byte bVar1;
  void *this;
  ostream *poVar2;
  byte in_SIL;
  char *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  std::operator<<((ostream *)&std::cout,"[");
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  this = (void *)std::ostream::operator<<(&std::cout,std::right);
  testNo = testNo + 1;
  poVar2 = (ostream *)std::ostream::operator<<(this,testNo);
  std::operator<<(poVar2,"] ");
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x28);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
  poVar2 = std::operator<<(poVar2,in_RDI);
  std::operator<<(poVar2," ... ");
  std::ostream::flush();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SKIPPED");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    skipped = skipped + 1;
  }
  else {
    main::anon_class_40_5_9dbf9e49::operator()
              ((anon_class_40_5_9dbf9e49 *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
    poVar2 = std::operator<<((ostream *)&std::cout,"PASSED");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void runTest(const char* name, bool condition, FUNC f) {
	std::cout << "[";
	std::cout.width(2);
	std::cout << std::right << ++testNo << "] ";
	std::cout.width(40);
	std::cout << std::left << name << " ... ";
	std::cout.flush();
	if (condition) {
		f();
		std::cout << "PASSED" << std::endl;
	}
	else {
		std::cout << "SKIPPED" << std::endl;
		skipped++;
	}
}